

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_shared_ptr.cpp
# Opt level: O2

void __thiscall Fixture::Fixture(Fixture *this,IObjectSharedState *state_,char *name_)

{
  int iVar1;
  
  this->state = state_;
  this->start_state_count = 0;
  this->start_obj_count = 0;
  this->name = name_;
  rcc::shared_ptr<TestSharedPtrObj>::shared_ptr(&this->ptr,state_);
  rcc::weak_ptr<TestSharedPtrObj>::weak_ptr(&this->weak,state_);
  iVar1 = IObjectSharedState::StateCount(state_);
  this->start_state_count = iVar1;
  iVar1 = IObjectSharedState::ObjectCount(state_);
  this->start_obj_count = iVar1;
  return;
}

Assistant:

Fixture(IObjectSharedState* state_, const char* name_)
        : state(state_)
        , weak(state_)
        , ptr(state_)
        , name(name_){
        start_state_count = state_->StateCount();
        start_obj_count = state_->ObjectCount();
    }